

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_recover
              (secp256k1_context *ctx,uchar *deckey32,secp256k1_ecdsa_signature *sig,
              uchar *adaptor_sig162,secp256k1_pubkey *enckey)

{
  int iVar1;
  size_t *in_RCX;
  secp256k1_ecdsa_signature *in_RDX;
  uchar *in_RSI;
  secp256k1_context *in_RDI;
  long in_R8;
  int ret;
  size_t size;
  uchar enckey_expected33 [33];
  uchar enckey33 [33];
  secp256k1_gej enckey_expected_gej;
  secp256k1_ge enckey_expected_ge;
  secp256k1_scalar deckey;
  secp256k1_scalar r;
  secp256k1_scalar s;
  secp256k1_scalar adaptor_sigr;
  secp256k1_scalar sp;
  char *in_stack_fffffffffffffdd8;
  secp256k1_callback *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  uint uVar2;
  secp256k1_scalar *sp_00;
  char in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffdf9;
  secp256k1_scalar *in_stack_fffffffffffffe00;
  secp256k1_ge *in_stack_fffffffffffffe08;
  secp256k1_scalar *in_stack_fffffffffffffe10;
  secp256k1_scalar *in_stack_fffffffffffffe18;
  secp256k1_scalar *in_stack_fffffffffffffe20;
  char in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe29;
  secp256k1_ge *in_stack_fffffffffffffe30;
  uint in_stack_fffffffffffffe3c;
  secp256k1_pubkey *in_stack_fffffffffffffe40;
  size_t *in_stack_fffffffffffffe48;
  uchar *in_stack_fffffffffffffe50;
  secp256k1_context *in_stack_fffffffffffffe58;
  secp256k1_scalar *in_stack_fffffffffffffea0;
  secp256k1_gej *in_stack_fffffffffffffea8;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffffeb0;
  undefined1 local_128 [88];
  secp256k1_scalar local_d0;
  secp256k1_scalar local_b0;
  secp256k1_scalar local_90;
  secp256k1_scalar *in_stack_ffffffffffffffa8;
  secp256k1_scalar *in_stack_ffffffffffffffb0;
  uint local_4;
  
  sp_00 = (secp256k1_scalar *)0x21;
  uVar2 = 1;
  iVar1 = secp256k1_ecmult_gen_context_is_built(&in_RDI->ecmult_gen_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    local_4 = 0;
  }
  else if (in_RSI == (uchar *)0x0) {
    secp256k1_callback_call(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    local_4 = 0;
  }
  else if (in_RDX == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    local_4 = 0;
  }
  else if (in_RCX == (size_t *)0x0) {
    secp256k1_callback_call(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    local_4 = 0;
  }
  else if (in_R8 == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                      (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                       (secp256k1_ge *)CONCAT71(in_stack_fffffffffffffdf9,in_stack_fffffffffffffdf8)
                       ,sp_00,(secp256k1_scalar *)CONCAT44(uVar2,in_stack_fffffffffffffde8),
                       (secp256k1_scalar *)in_stack_fffffffffffffde0,
                       (uchar *)in_stack_fffffffffffffe20);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      secp256k1_ecdsa_signature_load(in_RDI,&local_b0,&local_90,in_RDX);
      local_4 = secp256k1_scalar_eq((secp256k1_scalar *)&stack0xffffffffffffff90,&local_b0);
      local_4 = local_4 & uVar2;
      iVar1 = secp256k1_scalar_is_zero(&local_90);
      local_4 = ((iVar1 != 0 ^ 0xffU) & 1) & local_4;
      secp256k1_scalar_inverse(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      secp256k1_scalar_mul
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      secp256k1_ecmult_gen
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      secp256k1_ge_set_gej
                (in_stack_fffffffffffffe30,
                 (secp256k1_gej *)CONCAT71(in_stack_fffffffffffffe29,in_stack_fffffffffffffe28));
      secp256k1_declassify(in_RDI,local_128,0x58);
      iVar1 = secp256k1_eckey_pubkey_serialize
                        ((secp256k1_ge *)CONCAT44(local_4,in_stack_fffffffffffffde8),
                         (uchar *)in_stack_fffffffffffffde0,in_RCX,0);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        iVar1 = secp256k1_ec_pubkey_serialize
                          (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                           in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                           in_stack_fffffffffffffe3c);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          iVar1 = secp256k1_memcmp_var(&stack0xfffffffffffffdf9,&stack0xfffffffffffffe29,0x20);
          if (iVar1 == 0) {
            if (in_stack_fffffffffffffdf8 != in_stack_fffffffffffffe28) {
              secp256k1_scalar_negate
                        (sp_00,(secp256k1_scalar *)CONCAT44(local_4,in_stack_fffffffffffffde8));
            }
            secp256k1_scalar_get_b32(in_RSI,&local_d0);
            secp256k1_scalar_clear(&local_d0);
            secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffffb0);
            secp256k1_scalar_clear(&local_90);
          }
          else {
            local_4 = 0;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_adaptor_recover(const secp256k1_context* ctx, unsigned char *deckey32, const secp256k1_ecdsa_signature *sig, const unsigned char *adaptor_sig162, const secp256k1_pubkey *enckey) {
    secp256k1_scalar sp, adaptor_sigr;
    secp256k1_scalar s, r;
    secp256k1_scalar deckey;
    secp256k1_ge enckey_expected_ge;
    secp256k1_gej enckey_expected_gej;
    unsigned char enckey33[33];
    unsigned char enckey_expected33[33];
    size_t size = 33;
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(deckey32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(adaptor_sig162 != NULL);
    ARG_CHECK(enckey != NULL);

    if (!secp256k1_ecdsa_adaptor_sig_deserialize(NULL, &adaptor_sigr, NULL, &sp, NULL, NULL, adaptor_sig162)) {
        return 0;
    }
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    /* Check that we're not looking at some unrelated signature */
    ret &= secp256k1_scalar_eq(&adaptor_sigr, &r);
    /* y = s⁻¹ * s' */
    ret &= !secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_inverse(&deckey, &s);
    secp256k1_scalar_mul(&deckey, &deckey, &sp);

    /* Deal with ECDSA malleability */
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &enckey_expected_gej, &deckey);
    secp256k1_ge_set_gej(&enckey_expected_ge, &enckey_expected_gej);
    /* We declassify non-secret enckey_expected_ge to allow using it as a
     * branch point. */
    secp256k1_declassify(ctx, &enckey_expected_ge, sizeof(enckey_expected_ge));
    if (!secp256k1_eckey_pubkey_serialize(&enckey_expected_ge, enckey_expected33, &size, SECP256K1_EC_COMPRESSED)) {
        /* Unreachable from tests (and other VERIFY builds) and therefore this
         * branch should be ignored in test coverage analysis.
         *
         * Proof:
         *     eckey_pubkey_serialize fails <=> deckey = 0
         *     deckey = 0 <=> s^-1 = 0 or sp = 0
         *     case 1: s^-1 = 0 impossible by the definition of multiplicative
         *             inverse and because the scalar_inverse implementation
         *             VERIFY_CHECKs that the inputs are valid scalars.
         *     case 2: sp = 0 impossible because ecdsa_adaptor_sig_deserialize would have already failed
         */
        return 0;
    }
    if (!secp256k1_ec_pubkey_serialize(ctx, enckey33, &size, enckey, SECP256K1_EC_COMPRESSED)) {
        return 0;
    }
    if (secp256k1_memcmp_var(&enckey_expected33[1], &enckey33[1], 32) != 0) {
        return 0;
    }
    if (enckey_expected33[0] != enckey33[0]) {
        /* try Y_implied == -Y */
        secp256k1_scalar_negate(&deckey, &deckey);
    }
    secp256k1_scalar_get_b32(deckey32, &deckey);

    secp256k1_scalar_clear(&deckey);
    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_clear(&s);

    return ret;
}